

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O0

void xs::Message::writeHeader(MessageType type,size_t messageSize,deUint8 *dst,size_t bufSize)

{
  deBool dVar1;
  Error *this;
  int local_3c;
  int local_38;
  int netType;
  int netSize;
  ulong local_28;
  size_t bufSize_local;
  deUint8 *dst_local;
  size_t messageSize_local;
  MessageType type_local;
  
  local_28 = bufSize;
  bufSize_local = (size_t)dst;
  dst_local = (deUint8 *)messageSize;
  messageSize_local._4_4_ = type;
  do {
    dVar1 = deGetFalse();
    if (dVar1 != 0 || local_28 < 8) {
      this = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this,"Incomplete header","bufSize >= MESSAGE_HEADER_SIZE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsProtocol.cpp"
                   ,0x97);
      __cxa_throw(this,&Error::typeinfo,Error::~Error);
    }
    dVar1 = deGetFalse();
  } while (dVar1 != 0);
  local_38 = hostToNetwork<int>((int)dst_local);
  local_3c = hostToNetwork<int>(messageSize_local._4_4_);
  deMemcpy((void *)bufSize_local,&local_38,4);
  deMemcpy((void *)(bufSize_local + 4),&local_3c,4);
  return;
}

Assistant:

void Message::writeHeader (MessageType type, size_t messageSize, deUint8* dst, size_t bufSize)
{
	XS_CHECK_MSG(bufSize >= MESSAGE_HEADER_SIZE, "Incomplete header");
	int netSize = hostToNetwork((int)messageSize);
	int netType = hostToNetwork((int)type);
	deMemcpy(dst+0, &netSize, sizeof(netSize));
	deMemcpy(dst+4, &netType, sizeof(netType));
}